

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.h
# Opt level: O2

void __thiscall libsgp4::Tle::Tle(Tle *this,string *name,string *line_one,string *line_two)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->line_one_,(string *)line_one);
  std::__cxx11::string::string((string *)&this->line_two_,(string *)line_two);
  (this->int_designator_)._M_dataplus._M_p = (pointer)&(this->int_designator_).field_2;
  (this->int_designator_)._M_string_length = 0;
  (this->int_designator_).field_2._M_local_buf[0] = '\0';
  DateTime::DateTime(&this->epoch_);
  this->mean_motion_ = 0.0;
  this->norad_number_ = 0;
  this->orbit_number_ = 0;
  this->argument_perigee_ = 0.0;
  this->mean_anomaly_ = 0.0;
  this->right_ascending_node_ = 0.0;
  this->eccentricity_ = 0.0;
  this->bstar_ = 0.0;
  this->inclination_ = 0.0;
  this->mean_motion_dt2_ = 0.0;
  this->mean_motion_ddt6_ = 0.0;
  Initialize(this);
  return;
}

Assistant:

Tle(std::string name, std::string line_one, std::string line_two)
        : name_(std::move(name))
        , line_one_(std::move(line_one))
        , line_two_(std::move(line_two))
    {
        Initialize();
    }